

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> * __thiscall
Clara::CommandLine<Catch::ConfigData>::populateOptions
          (vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>
           *__return_storage_ptr__,CommandLine<Catch::ConfigData> *this,
          vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *tokens,
          ConfigData *config)

{
  reference this_00;
  bool bVar1;
  Token *pTVar2;
  const_reference __x;
  size_type sVar3;
  const_reference pvVar4;
  domain_error *this_01;
  exception *ex;
  string local_88 [48];
  reference local_58;
  Arg *arg;
  const_iterator itEnd;
  const_iterator it;
  Token *token;
  size_t i;
  ConfigData *config_local;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *tokens_local;
  CommandLine<Catch::ConfigData> *this_local;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *unusedTokens;
  
  std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::vector
            (__return_storage_ptr__);
  token = (Token *)0x0;
  do {
    pTVar2 = (Token *)std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::size
                                (tokens);
    if (pTVar2 <= token) {
      return __return_storage_ptr__;
    }
    __x = std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::operator[]
                    (tokens,(size_type)token);
    itEnd = std::
            vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
            ::begin(&this->m_options);
    arg = (Arg *)std::
                 vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
                 ::end(&this->m_options);
    while (bVar1 = __gnu_cxx::operator!=
                             (&itEnd,(__normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
                                      *)&arg), bVar1) {
      local_58 = __gnu_cxx::
                 __normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
                 ::operator*(&itEnd);
      if (((__x->type == ShortOpt) && (bVar1 = Arg::hasShortName(local_58,&__x->data), bVar1)) ||
         ((__x->type == LongOpt && (bVar1 = Arg::hasLongName(local_58,&__x->data), bVar1)))) {
        bVar1 = Arg::takesArg(local_58);
        if (bVar1) {
          sVar3 = std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::size
                            (tokens);
          if ((token == (Token *)(sVar3 - 1)) ||
             (pvVar4 = std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::
                       operator[](tokens,(size_type)((long)&token->type + 1)), this_00 = local_58,
             pvVar4->type != Positional)) {
            this_01 = (domain_error *)__cxa_allocate_exception(0x10);
            std::operator+((char *)local_88,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "Expected argument to option ");
            std::domain_error::domain_error(this_01,local_88);
            __cxa_throw(this_01,&std::domain_error::typeinfo,std::domain_error::~domain_error);
          }
          token = (Token *)((long)&token->type + 1);
          pvVar4 = std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::
                   operator[](tokens,(size_type)token);
          Detail::BoundArgFunction<Catch::ConfigData>::set
                    (&this_00->boundField,config,&pvVar4->data);
        }
        else {
          Detail::BoundArgFunction<Catch::ConfigData>::setFlag(&local_58->boundField,config);
        }
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
      ::operator++(&itEnd);
    }
    bVar1 = __gnu_cxx::operator==
                      (&itEnd,(__normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
                               *)&arg);
    if (bVar1) {
      std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::push_back
                (__return_storage_ptr__,__x);
    }
    token = (Token *)((long)&token->type + 1);
  } while( true );
}

Assistant:

std::vector<Parser::Token> populateOptions( std::vector<Parser::Token> const& tokens, ConfigT& config ) const {
            std::vector<Parser::Token> unusedTokens;
            for( std::size_t i = 0; i < tokens.size(); ++i ) {
                Parser::Token const& token = tokens[i];
                typename std::vector<Arg>::const_iterator it = m_options.begin(), itEnd = m_options.end();
                for(; it != itEnd; ++it ) {
                    Arg const& arg = *it;

                    try {
                        if( ( token.type == Parser::Token::ShortOpt && arg.hasShortName( token.data ) ) ||
                            ( token.type == Parser::Token::LongOpt && arg.hasLongName( token.data ) ) ) {
                            if( arg.takesArg() ) {
                                if( i == tokens.size()-1 || tokens[i+1].type != Parser::Token::Positional )
                                    throw std::domain_error( "Expected argument to option " + token.data );
                                arg.boundField.set( config, tokens[++i].data );
                            }
                            else {
                                arg.boundField.setFlag( config );
                            }
                            break;
                        }
                    }
                    catch( std::exception& ex ) {
                        throw std::runtime_error( std::string( ex.what() ) + "\n- while parsing: (" + arg.commands() + ")" );
                    }
                }
                if( it == itEnd )
                    unusedTokens.push_back( token );
            }
            return unusedTokens;
        }